

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O2

vector<quadraple,_std::allocator<quadraple>_> * __thiscall
LexicalAnalyzer::GetResult
          (vector<quadraple,_std::allocator<quadraple>_> *__return_storage_ptr__,
          LexicalAnalyzer *this)

{
  pointer pqVar1;
  pointer pqVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  int i;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "=============================================================");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"Found ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,' ');
  poVar4 = std::operator<<(poVar4,"lexical error(s)");
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar10 = 0;
  for (uVar6 = 0;
      uVar6 < (ulong)(((long)(this->error).super__Vector_base<quadraple,_std::allocator<quadraple>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->error).super__Vector_base<quadraple,_std::allocator<quadraple>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x48); uVar6 = uVar6 + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"At line ");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,*(int *)((long)&((this->error).
                                                super__Vector_base<quadraple,_std::allocator<quadraple>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                               linenumber + lVar10));
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = std::operator<<(poVar4,"position ");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,*(int *)((long)&((this->error).
                                                super__Vector_base<quadraple,_std::allocator<quadraple>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                               lineposition + lVar10));
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = std::operator<<(poVar4,(string *)
                                    ((long)&(((this->error).
                                              super__Vector_base<quadraple,_std::allocator<quadraple>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            attributevalue)._M_dataplus._M_p + lVar10));
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar10 = lVar10 + 0x48;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "=============================================================");
  std::endl<char,std::char_traits<char>>(poVar4);
  pqVar1 = (this->result).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.
           super__Vector_impl_data._M_start;
  pqVar2 = (this->result).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar5 = &pqVar1->lineposition;
  iVar8 = 0;
  iVar7 = 0;
  for (uVar6 = 0; uVar6 < (ulong)(((long)pqVar2 - (long)pqVar1) / 0x48); uVar6 = uVar6 + 1) {
    iVar3 = iVar8 + 1;
    iVar9 = iVar8;
    if (piVar5[-1] != iVar7) {
      iVar9 = 0;
      iVar3 = 1;
    }
    iVar8 = iVar3;
    iVar7 = iVar7 + (uint)(piVar5[-1] != iVar7);
    *piVar5 = iVar9;
    piVar5 = piVar5 + 0x12;
  }
  std::vector<quadraple,_std::allocator<quadraple>_>::vector(__return_storage_ptr__,&this->result);
  return __return_storage_ptr__;
}

Assistant:

std::vector<quadraple> LexicalAnalyzer::GetResult() {
    std::cout<<"============================================================="<<std::endl;
    std::cout<<"Found "<<error.size()<<' '<<"lexical error(s)"<<std::endl;
    for(int i=0;i<error.size();i++){
        std::cout<<"At line "<<error[i].linenumber<<' '<<"position "<<error[i].lineposition<<':'<<error[i].attributevalue<<std::endl;
    }
    std::cout<<"============================================================="<<std::endl;
    int linepos = 0, lineid = 0;
    for (int i = 0; i < result.size(); i++) {
        if (result[i].linenumber == lineid) {
            result[i].lineposition = linepos;
            ++linepos;
        } else {
            result[i].lineposition = 0;
            linepos = 1;
            ++lineid;
        }
    }
    return result;
}